

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

QString * defaultLibexecDir(void)

{
  QString *in_RDI;
  QLatin1StringView latin1;
  
  latin1.m_data = "libexec";
  latin1.m_size = 7;
  QString::QString(in_RDI,latin1);
  return in_RDI;
}

Assistant:

QString defaultLibexecDir()
{
#ifdef Q_OS_WIN32
    return "bin"_L1;
#else
    return "libexec"_L1;
#endif
}